

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_greaterThan_vec3(ShaderEvalContext *c)

{
  float *pfVar1;
  int i;
  long lVar2;
  float fStack_48;
  Vector<bool,_3> res;
  Vector<float,_3> res_1;
  undefined8 local_30;
  float local_28;
  float local_24;
  undefined8 local_20;
  int aiStack_18 [6];
  
  local_24 = c->in[0].m_data[2];
  local_20 = *(undefined8 *)c->in[0].m_data;
  local_30 = *(undefined8 *)(c->in[1].m_data + 1);
  local_28 = c->in[1].m_data[0];
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  lVar2 = 0;
  do {
    pfVar1 = (float *)((long)&local_30 + lVar2 * 4);
    res.m_data[lVar2] = *pfVar1 <= (&local_24)[lVar2] && (&local_24)[lVar2] != *pfVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_1.m_data[2] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = (float)(int)res.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar2]] = (&fStack_48)[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }